

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceDecomposition.cpp
# Opt level: O3

bool __thiscall
OpenMD::ForceDecomposition::checkNeighborList
          (ForceDecomposition *this,
          vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> *savedPositions
          )

{
  Snapshot *pSVar1;
  pointer pVVar2;
  bool bVar3;
  pointer pVVar4;
  pointer pVVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  double dVar9;
  double tmp;
  double dVar10;
  double dVar11;
  Vector<double,_3U> result;
  double local_68 [4];
  double local_48 [4];
  
  dVar11 = this->skinThickness_;
  pSVar1 = this->snap_;
  pVVar5 = (pSVar1->cgData).position.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  pVVar2 = (pSVar1->cgData).position.
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  lVar8 = (long)pVVar2 - (long)pVVar5;
  if (this->needVelocities_ == true) {
    DataStorage::setStorageLayout(&pSVar1->cgData,3);
  }
  pVVar4 = (savedPositions->
           super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
           _M_impl.super__Vector_impl_data._M_start;
  bVar3 = true;
  if ((long)(savedPositions->
            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>).
            _M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 == lVar8) {
    dVar11 = dVar11 * 0.5;
    if (pVVar2 == pVVar5) {
      dVar9 = 0.0;
    }
    else {
      lVar8 = (lVar8 >> 3) * -0x5555555555555555;
      pVVar5 = (this->snap_->cgData).position.
               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      dVar9 = 0.0;
      lVar6 = 0;
      do {
        local_68[0] = 0.0;
        local_68[1] = 0.0;
        local_68[2] = 0.0;
        lVar7 = 0;
        do {
          local_68[lVar7] =
               *(double *)((long)(pVVar5->super_Vector<double,_3U>).data_ + lVar7 * 8) -
               (pVVar4->super_Vector<double,_3U>).data_[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        local_48[2] = local_68[2];
        local_48[0] = local_68[0];
        local_48[1] = local_68[1];
        dVar10 = 0.0;
        lVar7 = 0;
        do {
          dVar10 = dVar10 + local_48[lVar7] * local_48[lVar7];
          lVar7 = lVar7 + 1;
        } while (lVar7 != 3);
        if (dVar10 <= dVar9) {
          dVar10 = dVar9;
        }
        dVar9 = dVar10;
        lVar6 = lVar6 + 1;
        pVVar4 = pVVar4 + 1;
        pVVar5 = pVVar5 + 1;
      } while (lVar6 != lVar8 + (ulong)(lVar8 == 0));
    }
    bVar3 = dVar11 * dVar11 < dVar9;
  }
  return bVar3;
}

Assistant:

bool ForceDecomposition::checkNeighborList(vector<Vector3d> savedPositions) {
    RealType st2        = pow(skinThickness_ / 2.0, 2);
    std::size_t nGroups = snap_->cgData.position.size();
    if (needVelocities_)
      snap_->cgData.setStorageLayout(DataStorage::dslPosition |
                                     DataStorage::dslVelocity);

    // if we have changed the group identities or haven't set up the
    // saved positions we automatically will need a neighbor list update:

    if (savedPositions.size() != nGroups) return true;

    RealType dispmax = 0.0;
    Vector3d disp;

    for (std::size_t i = 0; i < nGroups; i++) {
      disp    = snap_->cgData.position[i] - savedPositions[i];
      dispmax = max(dispmax, disp.lengthSquare());
    }

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &dispmax, 1, MPI_REALTYPE, MPI_MAX,
                  MPI_COMM_WORLD);
#endif

    return (dispmax > st2) ? true : false;
  }